

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

baseHolder * __thiscall
cs_impl::any::
holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
::duplicate(holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
            *this)

{
  holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>
  *phVar1;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_00000008;
  allocator_type<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>_>,_64UL,_cs_impl::default_allocator_provider>
  *in_stack_00000010;
  
  phVar1 = cs::
           allocator_type<cs_impl::any::holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
           ::
           alloc<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>&>
                     (in_stack_00000010,in_stack_00000008);
  return &phVar1->super_baseHolder;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}